

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_mDCV_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *white_x,
                  png_fixed_point *white_y,png_fixed_point *red_x,png_fixed_point *red_y,
                  png_fixed_point *green_x,png_fixed_point *green_y,png_fixed_point *blue_x,
                  png_fixed_point *blue_y,png_uint_32p mastering_maxDL,png_uint_32p mastering_minDL)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     ((info_ptr->valid & 0x80000) != 0)) {
    if (white_x != (png_fixed_point *)0x0) {
      *white_x = (uint)info_ptr->mastering_white_x * 2;
    }
    if (white_y != (png_fixed_point *)0x0) {
      *white_y = (uint)info_ptr->mastering_white_y * 2;
    }
    if (red_x != (png_fixed_point *)0x0) {
      *red_x = (uint)info_ptr->mastering_red_x * 2;
    }
    if (red_y != (png_fixed_point *)0x0) {
      *red_y = (uint)info_ptr->mastering_red_y * 2;
    }
    if (green_x != (png_fixed_point *)0x0) {
      *green_x = (uint)info_ptr->mastering_green_x * 2;
    }
    if (green_y != (png_fixed_point *)0x0) {
      *green_y = (uint)info_ptr->mastering_green_y * 2;
    }
    if (blue_x != (png_fixed_point *)0x0) {
      *blue_x = (uint)info_ptr->mastering_blue_x * 2;
    }
    if (blue_y != (png_fixed_point *)0x0) {
      *blue_y = (uint)info_ptr->mastering_blue_y * 2;
    }
    if (mastering_maxDL != (png_uint_32p)0x0) {
      *mastering_maxDL = info_ptr->mastering_maxDL;
    }
    pVar1 = 0x80000;
    if (mastering_minDL != (png_uint_32p)0x0) {
      *mastering_minDL = info_ptr->mastering_minDL;
    }
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_mDCV_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *white_x, png_fixed_point *white_y,
    png_fixed_point *red_x, png_fixed_point *red_y,
    png_fixed_point *green_x, png_fixed_point *green_y,
    png_fixed_point *blue_x, png_fixed_point *blue_y,
    png_uint_32p mastering_maxDL, png_uint_32p mastering_minDL)
{
   png_debug1(1, "in %s retrieval function", "mDCV");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_mDCV) != 0)
   {
      if (white_x != NULL) *white_x = info_ptr->mastering_white_x * 2;
      if (white_y != NULL) *white_y = info_ptr->mastering_white_y * 2;
      if (red_x != NULL) *red_x = info_ptr->mastering_red_x * 2;
      if (red_y != NULL) *red_y = info_ptr->mastering_red_y * 2;
      if (green_x != NULL) *green_x = info_ptr->mastering_green_x * 2;
      if (green_y != NULL) *green_y = info_ptr->mastering_green_y * 2;
      if (blue_x != NULL) *blue_x = info_ptr->mastering_blue_x * 2;
      if (blue_y != NULL) *blue_y = info_ptr->mastering_blue_y * 2;
      if (mastering_maxDL != NULL) *mastering_maxDL = info_ptr->mastering_maxDL;
      if (mastering_minDL != NULL) *mastering_minDL = info_ptr->mastering_minDL;
      return PNG_INFO_mDCV;
   }

   return 0;
}